

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfile.h
# Opt level: O0

ssize_t hwrite(hFILE *fp,void *buffer,size_t nbytes)

{
  size_t local_30;
  size_t local_28;
  size_t n;
  size_t nbytes_local;
  void *buffer_local;
  hFILE *fp_local;
  
  local_28 = (long)fp->limit - (long)fp->begin;
  if (nbytes < local_28) {
    local_28 = nbytes;
  }
  memcpy(fp->begin,buffer,local_28);
  fp->begin = fp->begin + local_28;
  if (local_28 == nbytes) {
    local_30 = local_28;
  }
  else {
    local_30 = hwrite2(fp,buffer,nbytes,local_28);
  }
  return local_30;
}

Assistant:

static inline ssize_t HTS_RESULT_USED
hwrite(hFILE *fp, const void *buffer, size_t nbytes)
{
    extern ssize_t hwrite2(hFILE *, const void *, size_t, size_t);

    size_t n = fp->limit - fp->begin;
    if (n > nbytes) n = nbytes;
    memcpy(fp->begin, buffer, n);
    fp->begin += n;
    return (n==nbytes)? (ssize_t) n : hwrite2(fp, buffer, nbytes, n);
}